

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-send-unreachable.c
# Opt level: O3

void send_cb_recverr(uv_udp_send_t *req,int status)

{
  int iVar1;
  uv_handle_t *handle;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 auStack_20 [32];
  
  if (req == (uv_udp_send_t *)0x0) {
    auStack_20._0_8_ = (void *)0x1dedf9;
    send_cb_recverr_cold_3();
  }
  else {
    if ((status != -0x6f) && (status != 0)) goto LAB_001dee08;
    auStack_20._24_8_ = ZEXT18(req->handle == &client2 || req->handle == &client);
    auStack_20._16_8_ = 0;
    if ((uv_close_cb)auStack_20._24_8_ != (uv_close_cb)0x0) {
      send_cb_called = send_cb_called + 1;
      return;
    }
  }
  req = (uv_udp_send_t *)(auStack_20 + 0x18);
  auStack_20._0_8_ = (void *)0x1dee08;
  send_cb_recverr_cold_1();
LAB_001dee08:
  auStack_20._0_8_ = close_cb;
  send_cb_recverr_cold_2();
  auStack_20._0_8_ = (void *)0x1;
  iVar1 = uv_is_closing((uv_handle_t *)req);
  if ((void *)auStack_20._0_8_ == (void *)(long)iVar1) {
    close_cb_called = close_cb_called + 1;
    return;
  }
  handle = (uv_handle_t *)auStack_20;
  close_cb_cold_1();
  iVar1 = uv_is_closing(handle);
  if (iVar1 != 0) {
    return;
  }
  uv_close(handle,(uv_close_cb)0x0);
  return;
}

Assistant:

static void send_cb_recverr(uv_udp_send_t* req, int status) {
  ASSERT_PTR_NE(req, NULL);
  ASSERT(status == 0 || status == UV_ECONNREFUSED);
  CHECK_HANDLE(req->handle);
  send_cb_called++;
}